

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeCommandListAppendQueryKernelTimestampsPrologue
          (ZEParameterValidation *this,ze_command_list_handle_t hCommandList,uint32_t numEvents,
          ze_event_handle_t *phEvents,void *dstptr,size_t *pOffsets,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ze_result_t zVar1;
  
  if (hCommandList != (ze_command_list_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (dstptr != (void *)0x0 && phEvents != (ze_event_handle_t *)0x0) {
      zVar1 = ZE_RESULT_ERROR_INVALID_SIZE;
      if (phWaitEvents != (ze_event_handle_t *)0x0) {
        zVar1 = ZE_RESULT_SUCCESS;
      }
      if (numWaitEvents == 0) {
        zVar1 = ZE_RESULT_SUCCESS;
      }
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeCommandListAppendQueryKernelTimestampsPrologue(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numEvents,                             ///< [in] the number of timestamp events to query
        ze_event_handle_t* phEvents,                    ///< [in][range(0, numEvents)] handles of timestamp events to query
        void* dstptr,                                   ///< [in,out] pointer to memory where ::ze_kernel_timestamp_result_t will
                                                        ///< be written; must be size-aligned.
        const size_t* pOffsets,                         ///< [in][optional][range(0, numEvents)] offset, in bytes, to write
                                                        ///< results; address must be 4byte-aligned and offsets must be
                                                        ///< size-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    {
        if( nullptr == hCommandList )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phEvents )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == dstptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( (nullptr == phWaitEvents) && (0 < numWaitEvents) )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ZE_RESULT_SUCCESS;
    }